

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O0

_Bool aux_object(chunk_conflict1 *c,player *p,target_aux_state *auxst)

{
  ushort uVar1;
  loc_conflict grid;
  wchar_t floor_num_00;
  object **items;
  ui_event uVar2;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 local_1b8;
  object *obj_local;
  undefined4 local_190;
  wchar_t local_17c;
  wchar_t pos;
  undefined4 local_170;
  char local_158 [4];
  wchar_t floor_num;
  char out_val [256];
  _Bool result;
  object **floor_list;
  wchar_t floor_max;
  target_aux_state *auxst_local;
  player *p_local;
  chunk_conflict1 *c_local;
  
  uVar1 = z_info->floor_size;
  items = (object **)mem_zalloc((long)(int)(uint)uVar1 << 3);
  c_local._7_1_ = false;
  grid.x = (auxst->grid).x;
  grid.y = (auxst->grid).y;
  floor_num_00 = scan_distant_floor(items,(uint)uVar1,p,grid);
  if (floor_num_00 < L'\x01') {
    mem_free(items);
    c_local._7_1_ = false;
  }
  else {
    auxst->boring = false;
    track_object(p->upkeep,*items);
    handle_stuff(p);
    if (floor_num_00 < L'\x02') {
      uVar2 = target_recall_loop_object
                        (*items,(auxst->grid).y,(auxst->grid).x,local_158,auxst->phrase1,
                         auxst->phrase2,"",auxst->coord_desc,p);
      local_1b8 = CONCAT31(local_1b8._1_3_,uVar2.key.mods);
      (auxst->press).mouse = uVar2.mouse;
      *(undefined4 *)((long)&auxst->press + 8) = local_1b8;
      if (((auxst->press).key.code != 0x9c) && ((auxst->press).key.code != 0x20)) {
        c_local._7_1_ = true;
      }
      if (((auxst->press).key.code == 0x20) && ((auxst->mode & 2U) == 0)) {
        c_local._7_1_ = true;
      }
    }
    else {
      while( true ) {
        if ((p->wizard & 1U) == 0) {
          strnfmt(local_158,0x100,"%s%sa pile of %d objects, %s.",auxst->phrase1,auxst->phrase2,
                  (ulong)(uint)floor_num_00,auxst);
        }
        else {
          in_stack_fffffffffffffe00 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),(auxst->grid).y);
          in_stack_fffffffffffffe08 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(auxst->grid).x);
          strnfmt(local_158,0x100,"%s%sa pile of %d objects, %s (%d:%d, noise=%d, scent=%d).",
                  auxst->phrase1,auxst->phrase2,(ulong)(uint)floor_num_00,auxst,
                  in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,
                  (uint)(c->noise).grids[(auxst->grid).y][(auxst->grid).x],
                  (uint)(c->scent).grids[(auxst->grid).y][(auxst->grid).x]);
        }
        prt(local_158,L'\0',L'\0');
        move_cursor_relative((auxst->grid).y,(auxst->grid).x);
        uVar2 = inkey_m();
        local_170 = CONCAT31(local_170._1_3_,uVar2.key.mods);
        (auxst->press).mouse = uVar2.mouse;
        *(undefined4 *)((long)&auxst->press + 8) = local_170;
        if ((((((auxst->press).type != EVT_MOUSE) || ((auxst->press).mouse.button != '\x01')) ||
             ((int)((uint)(auxst->press).mouse.x - col_map[Term->sidebar_mode]) /
              (int)(uint)tile_width + Term->offset_x != (auxst->grid).x)) ||
            ((int)((uint)(auxst->press).mouse.y - row_top_map[Term->sidebar_mode]) /
             (int)(uint)tile_height + Term->offset_y != (auxst->grid).y)) &&
           (((auxst->press).type != EVT_KBRD || ((auxst->press).key.code != 0x72)))) break;
        while( true ) {
          screen_save();
          show_floor(items,floor_num_00,L'\x8c',(item_tester)0x0);
          prt(local_158,L'\0',L'\0');
          uVar2 = inkey_m();
          local_190 = CONCAT31(local_190._1_3_,uVar2.key.mods);
          (auxst->press).mouse = uVar2.mouse;
          *(undefined4 *)((long)&auxst->press + 8) = local_190;
          screen_load();
          if ((auxst->press).type == EVT_MOUSE) {
            local_17c = (uint)(auxst->press).mouse.y + L'\xffffffff';
          }
          else {
            local_17c = (auxst->press).key.code + L'\xffffff9f';
          }
          if ((local_17c < L'\0') || (floor_num_00 <= local_17c)) break;
          track_object(p->upkeep,items[local_17c]);
          handle_stuff(p);
        }
      }
    }
    mem_free(items);
  }
  return c_local._7_1_;
}

Assistant:

static bool aux_object(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	int floor_max = z_info->floor_size;
	struct object **floor_list =
		mem_zalloc(floor_max * sizeof(*floor_list));
	bool result = false;
	char out_val[TARGET_OUT_VAL_SIZE];
	int floor_num;

	/* Scan all sensed objects in the grid */
	floor_num = scan_distant_floor(floor_list, floor_max, p, auxst->grid);
	if (floor_num <= 0) {
		mem_free(floor_list);
		return result;
	}

	/* Not boring */
	auxst->boring = false;

	track_object(p->upkeep, floor_list[0]);
	handle_stuff(p);

	/* If there is more than one item... */
	if (floor_num > 1) {
		while (1) {
			/* Describe the pile */
			if (p->wizard) {
				strnfmt(out_val, sizeof(out_val),
					"%s%sa pile of %d objects, %s (%d:%d, noise=%d, scent=%d).",
					auxst->phrase1,
					auxst->phrase2,
					floor_num,
					auxst->coord_desc,
					auxst->grid.y,
					auxst->grid.x,
					(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
					(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
			} else {
				strnfmt(out_val, sizeof(out_val),
					"%s%sa pile of %d objects, %s.",
					auxst->phrase1,
					auxst->phrase2,
					floor_num,
					auxst->coord_desc);
			}

			prt(out_val, 0, 0);
			move_cursor_relative(auxst->grid.y, auxst->grid.x);
			auxst->press = inkey_m();

			/* Display objects */
			if ((auxst->press.type == EVT_MOUSE
					&& auxst->press.mouse.button == 1
					&& KEY_GRID_X(auxst->press) ==
					auxst->grid.x
					&& KEY_GRID_Y(auxst->press) ==
					auxst->grid.y)
					|| (auxst->press.type == EVT_KBRD
					&& auxst->press.key.code == 'r')) {
				int pos;
				while (1) {
					/* Save screen */
					screen_save();

					/*
					 * Use OLIST_DEATH to show item labels
					 */
					show_floor(floor_list, floor_num,
						(OLIST_DEATH | OLIST_WEIGHT
						| OLIST_GOLD), NULL);

					/* Describe the pile */
					prt(out_val, 0, 0);
					auxst->press = inkey_m();

					/* Load screen */
					screen_load();

					if (auxst->press.type == EVT_MOUSE) {
						pos = auxst->press.mouse.y - 1;
					} else {
						pos = auxst->press.key.code -
							'a';
					}
					if (0 <= pos && pos < floor_num) {
						track_object(p->upkeep,
							floor_list[pos]);
						handle_stuff(p);
						continue;
					}
					break;
				}

				/*
				 * Now that the user's done with the display
				 * loop, let's do the outer loop over again.
				 */
				continue;
			}

			/* Done */
			break;
		}
	} else {
		/* Only one object to display */
		/* Get the single object in the list */
		struct object *obj_local = floor_list[0];

		/* Allow user to recall an object */
		auxst->press = target_recall_loop_object(obj_local,
			auxst->grid.y, auxst->grid.x, out_val, auxst->phrase1,
			auxst->phrase2, "", auxst->coord_desc, p);

		/* Stop on everything but "return"/"space" */
		if (auxst->press.key.code != KC_ENTER
				&& auxst->press.key.code != ' ') result = true;

		/* Sometimes stop at "space" key */
		if (auxst->press.key.code == ' '
				&& !(auxst->mode & (TARGET_LOOK))) result = true;
	}

	mem_free(floor_list);
	return result;
}